

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  Arena *this_00;
  Extension *pEVar1;
  undefined8 *puVar2;
  MessageLite *pMVar3;
  Nonnull<const_char_*> pcVar4;
  undefined1 *v1;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  undefined1 auStack_38 [16];
  
  v1 = auStack_38;
  pVar5 = Insert(this,number);
  pEVar1 = pVar5.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated == false) goto LAB_002887a2;
    pcVar4 = (Nonnull<const_char_*>)0x0;
LAB_00288751:
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      if (0xed < (byte)(pEVar1->type - 0x13)) {
        if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 10
           ) {
          pcVar4 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                              (ulong)pEVar1->type * 4),10,
                              "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
        }
        if (pcVar4 != (Nonnull<const_char_*>)0x0) goto LAB_0028881e;
        goto LAB_00288782;
      }
      AddMessage((ExtensionSet *)auStack_38);
LAB_002887bf:
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)v1,10,"cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE"
                         );
      goto LAB_0028870d;
    }
    AddMessage();
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      AddMessage((ExtensionSet *)auStack_38);
LAB_002887a2:
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,0,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                         );
      goto LAB_00288751;
    }
    v1 = (undefined1 *)(ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (v1 != (undefined1 *)0xa) goto LAB_002887bf;
    pcVar4 = (Nonnull<const_char_*>)0x0;
LAB_0028870d:
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      pEVar1->is_repeated = true;
      pEVar1->field_0xa = pEVar1->field_0xa | 1;
      this_00 = this->arena_;
      if (this_00 == (Arena *)0x0) {
        puVar2 = (undefined8 *)operator_new(0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = 0;
      }
      else {
        puVar2 = (undefined8 *)Arena::Allocate(this_00,0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = this_00;
      }
      *(undefined8 **)&(pEVar1->field_0).int32_t_value = puVar2;
LAB_00288782:
      pMVar3 = RepeatedPtrFieldBase::AddMessage((RepeatedPtrFieldBase *)pEVar1->field_0,prototype);
      return pMVar3;
    }
  }
  AddMessage();
LAB_0028881e:
  AddMessage();
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  return reinterpret_cast<internal::RepeatedPtrFieldBase*>(
             extension->ptr.repeated_message_value)
      ->AddMessage(&prototype);
}